

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O1

size_t __thiscall GF2::ZZ<130UL>::Log(ZZ<130UL> *this)

{
  ulong uVar1;
  size_t sVar2;
  
  sVar2 = 0x83;
  do {
    if (sVar2 == 1) {
      return 0;
    }
    uVar1 = sVar2 - 2;
    sVar2 = sVar2 - 1;
  } while (((this->super_WW<130UL>)._words[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0);
  return sVar2;
}

Assistant:

size_t Log() const
	{
		size_t k = _n;
		while (k)
            if (Test(k - 1)) 
				return k;
			else 
				--k;
		return k;		
	}